

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  ImGuiTable *pIVar2;
  ImGuiTableCellData *pIVar3;
  ulong uVar4;
  ImU32 IVar5;
  char cVar6;
  
  if (target == 0) {
    __assert_fail("target != ImGuiTableBgTarget_None",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x64c,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  uVar4 = (ulong)(uint)column_n;
  pIVar2 = GImGui->CurrentTable;
  IVar5 = 0;
  if (color != 0x1000000) {
    IVar5 = color;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar2->InnerClipRect).Max.y;
    if (*pfVar1 <= pIVar2->RowPosY1 && pIVar2->RowPosY1 != *pfVar1) {
      return;
    }
    if (column_n == -1) {
      pIVar2->RowBgColor[target == 2] = IVar5;
      return;
    }
    __assert_fail("column_n == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x668,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  if (target != 3) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x66e,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  pfVar1 = &(pIVar2->InnerClipRect).Max.y;
  if (*pfVar1 <= pIVar2->RowPosY1 && pIVar2->RowPosY1 != *pfVar1) {
    return;
  }
  if (column_n == -1) {
    uVar4 = (ulong)(uint)pIVar2->CurrentColumn;
  }
  if ((pIVar2->VisibleMaskByIndex >> (uVar4 & 0x3f) & 1) == 0) {
    return;
  }
  cVar6 = pIVar2->RowCellDataCurrent;
  if (-1 < cVar6) {
    pIVar3 = ImSpan<ImGuiTableCellData>::operator[](&pIVar2->RowCellData,(int)cVar6);
    cVar6 = pIVar2->RowCellDataCurrent;
    if ((int)uVar4 == (int)pIVar3->Column) goto LAB_0015c7a0;
  }
  cVar6 = cVar6 + '\x01';
  pIVar2->RowCellDataCurrent = cVar6;
LAB_0015c7a0:
  pIVar3 = ImSpan<ImGuiTableCellData>::operator[](&pIVar2->RowCellData,(int)cVar6);
  pIVar3->BgColor = IVar5;
  pIVar3->Column = (ImGuiTableColumnIdx)uVar4;
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}